

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O0

int main(void)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  uint local_24;
  GLFWwindow *pGStack_20;
  GLint value;
  GLFWwindow *window;
  int height;
  int width;
  int i;
  
  width = 0;
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 == 0) {
    exit(1);
  }
  glfwWindowHint(0x20004,0);
  pGStack_20 = glfwCreateWindow(0x280,0x1e0,"Defaults",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (pGStack_20 != (GLFWwindow *)0x0) {
    glfwMakeContextCurrent(pGStack_20);
    glfwGetFramebufferSize(pGStack_20,(int *)((long)&window + 4),(int *)&window);
    printf("framebuffer size: %ix%i\n",(ulong)window._4_4_,(ulong)(uint)window);
    height = 0;
    while (glfw_attribs[height].name != (char *)0x0) {
      pcVar1 = glfw_attribs[height].name;
      uVar3 = glfwGetWindowAttrib(pGStack_20,glfw_attribs[height].attrib);
      printf("%s: %i\n",pcVar1,(ulong)uVar3);
      height = height + 1;
    }
    height = 0;
    while (gl_attribs[height].name != (char *)0x0) {
      local_24 = 0;
      if ((gl_attribs[height].ext == (char *)0x0) ||
         (iVar2 = glfwExtensionSupported(gl_attribs[height].ext), iVar2 != 0)) {
        glGetIntegerv(gl_attribs[height].attrib,&local_24);
        printf("%s: %i\n",gl_attribs[height].name,(ulong)local_24);
      }
      height = height + 1;
    }
    glfwDestroyWindow(pGStack_20);
    pGStack_20 = (GLFWwindow *)0x0;
    glfwTerminate();
    exit(0);
  }
  glfwTerminate();
  exit(1);
}

Assistant:

int main(void)
{
    int i, width, height;
    GLFWwindow* window;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

    window = glfwCreateWindow(640, 480, "Defaults", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    glfwGetFramebufferSize(window, &width, &height);

    printf("framebuffer size: %ix%i\n", width, height);

    for (i = 0;  glfw_attribs[i].name;   i++)
    {
        printf("%s: %i\n",
               glfw_attribs[i].name,
               glfwGetWindowAttrib(window, glfw_attribs[i].attrib));
    }

    for (i = 0;  gl_attribs[i].name;   i++)
    {
        GLint value = 0;

        if (gl_attribs[i].ext)
        {
            if (!glfwExtensionSupported(gl_attribs[i].ext))
                continue;
        }

        glGetIntegerv(gl_attribs[i].attrib, &value);

        printf("%s: %i\n", gl_attribs[i].name, value);
    }

    glfwDestroyWindow(window);
    window = NULL;

    glfwTerminate();
    exit(EXIT_SUCCESS);
}